

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::VaryingLocationsTest::prepareShaderStage
          (VaryingLocationsTest *this,STAGES stage,Type *type,ProgramInterface *program_interface,
          VaryingPassthrough *varying_passthrough)

{
  GLint GVar1;
  undefined4 offset;
  ProgramInterface *pPVar2;
  GLchar *pGVar3;
  GLchar *text;
  ShaderInterface *this_00;
  reference pvVar4;
  size_type sVar5;
  string local_1a8;
  string local_188;
  Variable *local_168;
  Variable *last_out;
  Variable *first_out;
  Variable *pVStack_150;
  GLuint last_out_loc;
  Variable *last_in;
  Variable *first_in;
  undefined1 local_138 [8];
  string last_out_name;
  undefined1 local_110 [8];
  string last_in_name;
  undefined1 local_e8 [8];
  string first_out_name;
  allocator<char> local_b1;
  undefined1 local_b0 [8];
  string first_in_name;
  GLuint type_size;
  ShaderInterface *si;
  GLchar *qual_last_out;
  GLchar *qual_last_in;
  GLchar *qual_first_out;
  GLchar *qual_first_in;
  GLchar *prefix_out;
  GLchar *prefix_in;
  size_t position;
  GLuint last_in_loc;
  GLuint first_out_loc;
  GLuint first_in_loc;
  GLuint array_length;
  VaryingPassthrough *varying_passthrough_local;
  ProgramInterface *program_interface_local;
  Type *type_local;
  VaryingLocationsTest *pVStack_18;
  STAGES stage_local;
  VaryingLocationsTest *this_local;
  
  first_out_loc = 1;
  last_in_loc = 0;
  position._4_4_ = 0;
  _first_in_loc = varying_passthrough;
  varying_passthrough_local = (VaryingPassthrough *)program_interface;
  program_interface_local = (ProgramInterface *)type;
  type_local._4_4_ = stage;
  pVStack_18 = this;
  position._0_4_ = TestBase::getLastInputLocation((TestBase *)this,stage,type,1);
  prefix_in = (GLchar *)0x0;
  pGVar3 = Utils::ProgramInterface::GetStagePrefix(type_local._4_4_,VARYING_INPUT);
  text = Utils::ProgramInterface::GetStagePrefix(type_local._4_4_,VARYING_OUTPUT);
  qual_first_out = "layout (location = first_input_location)";
  qual_last_in = "layout (location = first_output_location)";
  qual_last_out = "layout (location = last_input_location)";
  si = (ShaderInterface *)anon_var_dwarf_105609;
  this_00 = Utils::ProgramInterface::GetShaderInterface
                      ((ProgramInterface *)varying_passthrough_local,type_local._4_4_);
  first_in_name.field_2._12_4_ = Utils::Type::GetSize((Type *)program_interface_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b0,"PREFIXfirst",&local_b1);
  std::allocator<char>::~allocator(&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e8,"PREFIXfirst",
             (allocator<char> *)(last_in_name.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(last_in_name.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_110,"PREFIXlast",
             (allocator<char> *)(last_out_name.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(last_out_name.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_138,"PREFIXlast",(allocator<char> *)((long)&first_in + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&first_in + 7));
  Utils::replaceToken("PREFIX",(size_t *)&prefix_in,pGVar3,(string *)local_b0);
  prefix_in = (GLchar *)0x0;
  Utils::replaceToken("PREFIX",(size_t *)&prefix_in,text,(string *)local_e8);
  prefix_in = (GLchar *)0x0;
  Utils::replaceToken("PREFIX",(size_t *)&prefix_in,pGVar3,(string *)local_110);
  prefix_in = (GLchar *)0x0;
  Utils::replaceToken("PREFIX",(size_t *)&prefix_in,text,(string *)local_138);
  if (type_local._4_4_ == FRAGMENT) {
    qual_first_out = "layout (location = first_input_location) flat";
    qual_last_out = "layout (location = last_input_location)  flat";
  }
  if (type_local._4_4_ == GEOMETRY) {
    qual_last_in = "layout (location = first_output_location) flat";
    si = (ShaderInterface *)anon_var_dwarf_105657;
  }
  pGVar3 = (GLchar *)std::__cxx11::string::c_str();
  pPVar2 = program_interface_local;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->m_first_data,0);
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_first_data);
  last_in = Utils::ShaderInterface::Input<void>
                      (this_00,pGVar3,qual_first_out,0,0,(Type *)pPVar2,'\0',0,0,0,pvVar4,sVar5);
  pGVar3 = (GLchar *)std::__cxx11::string::c_str();
  pPVar2 = program_interface_local;
  GVar1 = (GLint)position;
  offset = first_in_name.field_2._12_4_;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->m_last_data,0);
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_last_data);
  pVStack_150 = Utils::ShaderInterface::Input<void>
                          (this_00,pGVar3,qual_last_out,0,GVar1,(Type *)pPVar2,'\0',0,0,offset,
                           pvVar4,sVar5);
  if (type_local._4_4_ == FRAGMENT) {
    prepareGlobals_abi_cxx11_(&local_1a8,this,(GLint)position,0);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
  }
  else {
    first_out._4_4_ =
         TestBase::getLastOutputLocation
                   ((TestBase *)this,type_local._4_4_,(Type *)program_interface_local,1);
    pGVar3 = (GLchar *)std::__cxx11::string::c_str();
    pPVar2 = program_interface_local;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_first_data,0);
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_first_data);
    last_out = Utils::ShaderInterface::Output<void>
                         (this_00,pGVar3,qual_last_in,0,0,(Type *)pPVar2,'\0',0,0,0,pvVar4,sVar5);
    pGVar3 = (GLchar *)std::__cxx11::string::c_str();
    pPVar2 = program_interface_local;
    GVar1 = first_out._4_4_;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_last_data,0);
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_last_data);
    local_168 = Utils::ShaderInterface::Output<void>
                          (this_00,pGVar3,(GLchar *)si,0,GVar1,(Type *)pPVar2,'\0',0,0,0,pvVar4,
                           sVar5);
    prepareGlobals_abi_cxx11_(&local_188,this,(GLint)position,first_out._4_4_);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    Utils::VaryingPassthrough::Add(_first_in_loc,type_local._4_4_,last_in,last_out);
    Utils::VaryingPassthrough::Add(_first_in_loc,type_local._4_4_,pVStack_150,local_168);
  }
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)local_b0);
  return;
}

Assistant:

void VaryingLocationsTest::prepareShaderStage(Utils::Shader::STAGES stage, const Utils::Type& type,
											  Utils::ProgramInterface&   program_interface,
											  Utils::VaryingPassthrough& varying_passthrough)
{
	const GLuint array_length  = 1;
	const GLuint first_in_loc  = 0;
	const GLuint first_out_loc = 0;
	const GLuint last_in_loc   = getLastInputLocation(stage, type, array_length);
	size_t		 position	  = 0;

	const GLchar* prefix_in = Utils::ProgramInterface::GetStagePrefix(stage, Utils::Variable::VARYING_INPUT);

	const GLchar* prefix_out = Utils::ProgramInterface::GetStagePrefix(stage, Utils::Variable::VARYING_OUTPUT);

	const GLchar* qual_first_in  = "layout (location = first_input_location)";
	const GLchar* qual_first_out = "layout (location = first_output_location)";
	const GLchar* qual_last_in   = "layout (location = last_input_location)";
	const GLchar* qual_last_out  = "layout (location = last_output_location)";

	Utils::ShaderInterface& si		  = program_interface.GetShaderInterface(stage);
	const GLuint			type_size = type.GetSize();

	std::string first_in_name  = "PREFIXfirst";
	std::string first_out_name = "PREFIXfirst";
	std::string last_in_name   = "PREFIXlast";
	std::string last_out_name  = "PREFIXlast";

	Utils::replaceToken("PREFIX", position, prefix_in, first_in_name);
	position = 0;
	Utils::replaceToken("PREFIX", position, prefix_out, first_out_name);
	position = 0;
	Utils::replaceToken("PREFIX", position, prefix_in, last_in_name);
	position = 0;
	Utils::replaceToken("PREFIX", position, prefix_out, last_out_name);

	if (Utils::Shader::FRAGMENT == stage)
	{
		qual_first_in = "layout (location = first_input_location) flat";
		qual_last_in  = "layout (location = last_input_location)  flat";
	}
	if (Utils::Shader::GEOMETRY == stage)
	{
		qual_first_out = "layout (location = first_output_location) flat";
		qual_last_out  = "layout (location = last_output_location)  flat";
	}

	Utils::Variable* first_in = si.Input(
		first_in_name.c_str(), qual_first_in /* qualifiers */, 0 /* expected_componenet */,
		first_in_loc /* expected_location */, type /* type */, GL_FALSE /* normalized */, 0u /* n_array_elements */,
		0u /* stride */, 0u /* offset */, (GLvoid*)&m_first_data[0] /* data */, m_first_data.size() /* data_size */);

	Utils::Variable* last_in =
		si.Input(last_in_name.c_str(), qual_last_in /* qualifiers */, 0 /* expected_componenet */,
				 last_in_loc /* expected_location */, type /* type */, GL_FALSE /* normalized */,
				 0u /* n_array_elements */, 0u /* stride */, type_size /* offset */,
				 (GLvoid*)&m_last_data[0] /* data */, m_last_data.size() /* data_size */);

	if (Utils::Shader::FRAGMENT != stage)
	{
		const GLuint last_out_loc = getLastOutputLocation(stage, type, array_length);

		Utils::Variable* first_out =
			si.Output(first_out_name.c_str(), qual_first_out /* qualifiers */, 0 /* expected_componenet */,
					  first_out_loc /* expected_location */, type /* type */, GL_FALSE /* normalized */,
					  0u /* n_array_elements */, 0u /* stride */, 0u /* offset */, (GLvoid*)&m_first_data[0] /* data */,
					  m_first_data.size() /* data_size */);

		Utils::Variable* last_out = si.Output(
			last_out_name.c_str(), qual_last_out /* qualifiers */, 0 /* expected_componenet */,
			last_out_loc /* expected_location */, type /* type */, GL_FALSE /* normalized */, 0u /* n_array_elements */,
			0u /* stride */, 0u /* offset */, (GLvoid*)&m_last_data[0] /* data */, m_last_data.size() /* data_size */);

		si.m_globals = prepareGlobals(last_in_loc, last_out_loc);

		varying_passthrough.Add(stage, first_in, first_out);
		varying_passthrough.Add(stage, last_in, last_out);
	}
	else
	{
		/* No outputs for fragment shader, so last_output_location can be 0 */
		si.m_globals = prepareGlobals(last_in_loc, 0);
	}
}